

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::FeatureDescriptor::FeatureDescriptor
          (FeatureDescriptor *this,string *name,string *prefix,string *itemPathFormat,
          string *itemNameFormat,string *suffix)

{
  string *suffix_local;
  string *itemNameFormat_local;
  string *itemPathFormat_local;
  string *prefix_local;
  string *name_local;
  FeatureDescriptor *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  this->Supported = true;
  std::__cxx11::string::string((string *)&this->Prefix,(string *)prefix);
  std::__cxx11::string::string((string *)&this->Suffix,(string *)suffix);
  std::__cxx11::string::string((string *)&this->ItemPathFormat,(string *)itemPathFormat);
  std::__cxx11::string::string((string *)&this->ItemNameFormat,(string *)itemNameFormat);
  return;
}

Assistant:

cmComputeLinkInformation::FeatureDescriptor::FeatureDescriptor(
  std::string name, std::string prefix, std::string itemPathFormat,
  std::string itemNameFormat, std::string suffix)
  : Name(std::move(name))
  , Supported(true)
  , Prefix(std::move(prefix))
  , Suffix(std::move(suffix))
  , ItemPathFormat(std::move(itemPathFormat))
  , ItemNameFormat(std::move(itemNameFormat))
{
}